

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O2

void __thiscall
helics::TimeoutMonitor::pingReply(TimeoutMonitor *this,ActionMessage *cmd,CoreBroker *brk)

{
  int iVar1;
  pointer plVar2;
  byte bVar3;
  pointer plVar4;
  byte bVar5;
  byte bVar6;
  ActionMessage noforward;
  ActionMessage local_d0;
  
  iVar1 = (cmd->source_id).gid;
  if (iVar1 == (this->parentConnection).connection.gid) {
    (this->parentConnection).waitingForPingReply = false;
    this->waitingForConnection = false;
  }
  else {
    plVar2 = (this->connections).
             super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar5 = 0;
    bVar3 = 0;
    for (plVar4 = (this->connections).
                  super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>
                  ._M_impl.super__Vector_impl_data._M_start; plVar4 != plVar2; plVar4 = plVar4 + 1)
    {
      bVar6 = plVar4->waitingForPingReply;
      if (iVar1 == (plVar4->connection).gid) {
        plVar4->waitingForPingReply = false;
        bVar5 = bVar6;
        bVar6 = 0;
      }
      bVar3 = bVar3 | bVar6;
    }
    if ((byte)(~bVar3 & brk != (CoreBroker *)0x0 & bVar5) != 0) {
      ActionMessage::ActionMessage(&local_d0,cmd_broker_configure);
      local_d0.source_id.gid = (cmd->dest_id).gid;
      local_d0.messageID = 0x25f;
      local_d0.dest_id.gid = local_d0.source_id.gid;
      BrokerBase::addActionMessage(&brk->super_BrokerBase,&local_d0);
      ActionMessage::~ActionMessage(&local_d0);
    }
  }
  return;
}

Assistant:

void TimeoutMonitor::tick(CoreBroker* brk)
{
    // check the connections

    bool waiting = parentConnection.waitingForPingReply;
    auto now = std::chrono::steady_clock::now();

    if (!brk->isRoot() && parentConnection.waitingForPingReply) {
        if (now - parentConnection.lastPing > timeout) {
            // try to reset the connection to the broker
            // brokerReconnect()
            brk->sendToLogger(brk->global_broker_id_local,
                              LogLevels::ERROR_LEVEL,
                              brk->getIdentifier(),
                              "broker lost connection with parent");
            brk->sendErrorToImmediateBrokers(-5);
            brk->sendDisconnect(CMD_GLOBAL_DISCONNECT);
            brk->brokerState = BrokerBase::BrokerState::ERRORED;
            brk->addActionMessage(CMD_STOP);
        } else {  // ping again
            ActionMessage png(CMD_PING_PRIORITY);
            png.source_id = brk->global_broker_id_local;
            png.dest_id = brk->higher_broker_id;
            brk->transmit(parent_route_id, png);
        }
    }

    for (auto& conn : connections) {
        if (conn.waitingForPingReply) {
            waiting = true;
            if (now - conn.lastPing > timeout) {
                ActionMessage cerror(CMD_CONNECTION_ERROR);
                cerror.dest_id = brk->global_broker_id_local;
                cerror.source_id = conn.connection;
                brk->addActionMessage(cerror);
            } else {  // ping again
                ActionMessage png(CMD_PING);
                png.source_id = brk->global_broker_id_local;
                png.dest_id = conn.connection;
                brk->addActionMessage(png);
            }
        }
    }
    if (!waiting) {
        if (!brk->isRoot()) {
            if ((brk->isConnected()) && (brk->global_broker_id_local.isValid()) &&
                (brk->global_broker_id_local != parent_broker_id)) {
                // if (allFedWaiting())
                //{
                if (brk->higher_broker_id.isValid()) {
                    ActionMessage png(CMD_PING_PRIORITY);
                    png.source_id = brk->global_broker_id_local;
                    png.dest_id = brk->higher_broker_id;
                    brk->transmit(parent_route_id, png);
                    parentConnection.lastPing = now;
                    parentConnection.waitingForPingReply = true;
                }
                //}
            } else if ((brk->brokerState == BrokerBase::BrokerState::TERMINATED) ||
                       (brk->brokerState == BrokerBase::BrokerState::ERRORED)) {
                if (waitingForConnection) {
                    if (now - startWaiting > timeout) {
                        ActionMessage png(CMD_CHECK_CONNECTIONS);
                        png.source_id = brk->global_broker_id_local;
                        brk->addActionMessage(png);
                    }
                } else {
                    waitingForConnection = true;
                    startWaiting = now;
                }
            } else {
                if (waitingForConnection) {
                    if (now - startWaiting > timeout) {
                        ActionMessage png(CMD_CHECK_CONNECTIONS);
                        png.source_id = brk->global_broker_id_local;
                        brk->addActionMessage(png);
                    }
                } else {
                    waitingForConnection = true;
                    startWaiting = now;
                }
            }
        } else {  // brk is a root broker
            pingSub(brk);
        }
    }
}